

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

VariablePtr createVariableWithUnits(string *name,string *units)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VariablePtr VVar2;
  string *units_local;
  string *name_local;
  VariablePtr *v;
  
  libcellml::Variable::create();
  peVar1 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)name);
  libcellml::NamedEntity::setName((string *)peVar1);
  peVar1 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)name);
  libcellml::Variable::setUnits((string *)peVar1);
  VVar2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)name;
  return (VariablePtr)VVar2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::VariablePtr createVariableWithUnits(const std::string &name, const std::string &units)
{
    libcellml::VariablePtr v = libcellml::Variable::create();
    v->setName(name);
    v->setUnits(units);

    return v;
}